

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O0

void __thiscall egc::Sequencer::MSU(Sequencer *this,unsigned_short instruction)

{
  ushort address;
  unsigned_short word;
  unsigned_short address_00;
  ostream *poVar1;
  element_type *peVar2;
  unsigned_short local_2a;
  unsigned_short result;
  int resultTwoComplement;
  uint signA;
  uint signMk;
  short digitsA;
  short digitsMk;
  unsigned_short a;
  unsigned_short mk;
  unsigned_short k;
  unsigned_short instruction_local;
  Sequencer *this_local;
  
  address = instruction & 0x3ff;
  poVar1 = std::operator<<((ostream *)&std::cout,"MSU");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::oct);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,address);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  word = Memory::Read(peVar2,address,0);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  address_00 = Memory::Read(peVar2,0,0);
  signA._2_2_ = word & 0x3fff;
  signA._0_2_ = address_00 & 0x3fff;
  if ((word & 0x4000) != 0) {
    signA._2_2_ = -signA._2_2_;
  }
  if ((address_00 & 0x4000) != 0) {
    signA._0_2_ = -(ushort)signA;
  }
  local_2a = (unsigned_short)((int)(short)signA._2_2_ - (int)(short)(ushort)signA);
  if ((int)(short)signA._2_2_ - (int)(short)(ushort)signA < 1) {
    local_2a = local_2a & 0x7ffe;
  }
  else {
    local_2a = local_2a & 0x3fff;
  }
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar2,address,word);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar2,address_00,local_2a);
  return;
}

Assistant:

void egc::Sequencer::MSU (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "MSU" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);
    auto a = m_Memory->Read(00000u);

    auto digitsMk = static_cast<short>(mk & 037777u);
    auto digitsA = static_cast<short>(a & 037777u);

    auto signMk = mk & 040000u;
    auto signA = a & 040000u;

    if (signMk)
    {
        digitsMk *= -1;
    }
    if (signA)
    {
        digitsA *= -1;
    }

    auto resultTwoComplement = digitsMk - digitsA;

    unsigned short result;

    if (resultTwoComplement > 0)
    {
        result = static_cast<unsigned short>(resultTwoComplement) & 037777u;
    }
    else
    {
        result = static_cast<unsigned short>(resultTwoComplement) & 077777u - 000001u;
    }

    m_Memory->Write(k, mk);
    m_Memory->Write(a, result);
}